

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pShaderOptimizationTests.cpp
# Opt level: O2

ProgramData *
deqp::gles3::Performance::anon_unknown_1::defaultProgramData
          (ProgramData *__return_storage_ptr__,CaseShaderType shaderType,string *funcDefs,
          string *mainStatements)

{
  ProgramSources *pPVar1;
  CaseShaderType shaderType_00;
  allocator<char> local_56d;
  allocator<char> local_56c;
  allocator<char> local_56b;
  allocator<char> local_56a;
  allocator_type local_569;
  string fragPrec;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_548;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_528;
  string vtxPrec;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_488;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_468;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_448;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_428;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_408;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_388;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_368;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_348;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_328;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_308;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  undefined1 local_1e8 [40];
  undefined1 local_1c0 [40];
  Vec4 local_198;
  Vec4 local_188;
  Vec4 local_178;
  Vec4 local_168;
  AttribSpec local_158;
  ProgramSources local_f8;
  
  (anonymous_namespace)::getShaderPrecision_abi_cxx11_
            (&vtxPrec,(_anonymous_namespace_ *)0x0,(CaseShaderType)funcDefs);
  (anonymous_namespace)::getShaderPrecision_abi_cxx11_
            (&fragPrec,(_anonymous_namespace_ *)0x1,shaderType_00);
  memset(&local_f8,0,0xac);
  local_f8.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_f8.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_f8.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  local_f8.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  local_f8._193_8_ = 0;
  std::operator+(&local_2e8,"#version 300 es\nin ",&vtxPrec);
  std::operator+(&local_2c8,&local_2e8," vec4 a_position;\nin ");
  std::operator+(&local_2a8,&local_2c8,&vtxPrec);
  std::operator+(&local_288,&local_2a8," vec4 a_value;\nout ");
  std::operator+(&local_268,&local_288,&fragPrec);
  std::operator+(&local_248,&local_268," vec4 v_value;\n");
  if (shaderType == CASESHADERTYPE_VERTEX) {
    std::__cxx11::string::string((string *)&local_528,(string *)funcDefs);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_528,"",&local_56a);
  }
  std::operator+(&local_428,&local_248,&local_528);
  std::operator+(&local_408,&local_428,"void main (void)\n{\n\tgl_Position = a_position;\n\t");
  std::operator+(&local_3e8,&local_408,&vtxPrec);
  std::operator+(&local_3c8,&local_3e8," vec4 value = a_value;\n");
  if (shaderType == CASESHADERTYPE_VERTEX) {
    std::__cxx11::string::string((string *)&local_448,(string *)mainStatements);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_448,"",&local_56b);
  }
  std::operator+(&local_228,&local_3c8,&local_448);
  std::operator+(&local_208,&local_228,"\tv_value = value;\n}\n");
  glu::VertexSource::VertexSource((VertexSource *)local_1c0,&local_208);
  pPVar1 = glu::ProgramSources::operator<<(&local_f8,(ShaderSource *)local_1c0);
  std::operator+(&local_3a8,"#version 300 es\nlayout (location = 0) out ",&fragPrec);
  std::operator+(&local_388,&local_3a8," vec4 o_color;\nin ");
  std::operator+(&local_368,&local_388,&fragPrec);
  std::operator+(&local_348,&local_368," vec4 v_value;\n");
  if (shaderType == CASESHADERTYPE_FRAGMENT) {
    std::__cxx11::string::string((string *)&local_548,(string *)funcDefs);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_548,"",&local_56c);
  }
  std::operator+(&local_4c8,&local_348,&local_548);
  std::operator+(&local_4a8,&local_4c8,"void main (void)\n{\n\t");
  std::operator+(&local_488,&local_4a8,&fragPrec);
  std::operator+(&local_468,&local_488," vec4 value = v_value;\n");
  if (shaderType == CASESHADERTYPE_FRAGMENT) {
    std::__cxx11::string::string((string *)&local_4e8,(string *)mainStatements);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_4e8,"",&local_56d);
  }
  std::operator+(&local_328,&local_468,&local_4e8);
  std::operator+(&local_308,&local_328,"\to_color = value;\n}\n");
  glu::FragmentSource::FragmentSource((FragmentSource *)local_1e8,&local_308);
  pPVar1 = glu::ProgramSources::operator<<(pPVar1,(ShaderSource *)local_1e8);
  local_168.m_data[0] = 1.0;
  local_168.m_data[1] = 0.0;
  local_168.m_data[2] = 0.0;
  local_168.m_data[3] = 0.0;
  local_178.m_data[0] = 0.0;
  local_178.m_data[1] = 1.0;
  local_178.m_data[2] = 0.0;
  local_178.m_data[3] = 0.0;
  local_188.m_data[0] = 0.0;
  local_188.m_data[1] = 0.0;
  local_188.m_data[2] = 1.0;
  local_188.m_data[3] = 0.0;
  local_198.m_data[0] = 0.0;
  local_198.m_data[1] = 0.0;
  local_198.m_data[2] = 0.0;
  local_198.m_data[3] = 1.0;
  deqp::gls::AttribSpec::AttribSpec
            (&local_158,"a_value",&local_168,&local_178,&local_188,&local_198);
  glu::ProgramSources::ProgramSources(&__return_storage_ptr__->sources,pPVar1);
  std::vector<deqp::gls::AttribSpec,_std::allocator<deqp::gls::AttribSpec>_>::vector
            (&__return_storage_ptr__->attributes,1,&local_158,&local_569);
  std::__cxx11::string::~string((string *)&local_158);
  std::__cxx11::string::~string((string *)(local_1e8 + 8));
  std::__cxx11::string::~string((string *)&local_308);
  std::__cxx11::string::~string((string *)&local_328);
  std::__cxx11::string::~string((string *)&local_4e8);
  std::__cxx11::string::~string((string *)&local_468);
  std::__cxx11::string::~string((string *)&local_488);
  std::__cxx11::string::~string((string *)&local_4a8);
  std::__cxx11::string::~string((string *)&local_4c8);
  std::__cxx11::string::~string((string *)&local_548);
  std::__cxx11::string::~string((string *)&local_348);
  std::__cxx11::string::~string((string *)&local_368);
  std::__cxx11::string::~string((string *)&local_388);
  std::__cxx11::string::~string((string *)&local_3a8);
  std::__cxx11::string::~string((string *)(local_1c0 + 8));
  std::__cxx11::string::~string((string *)&local_208);
  std::__cxx11::string::~string((string *)&local_228);
  std::__cxx11::string::~string((string *)&local_448);
  std::__cxx11::string::~string((string *)&local_3c8);
  std::__cxx11::string::~string((string *)&local_3e8);
  std::__cxx11::string::~string((string *)&local_408);
  std::__cxx11::string::~string((string *)&local_428);
  std::__cxx11::string::~string((string *)&local_528);
  std::__cxx11::string::~string((string *)&local_248);
  std::__cxx11::string::~string((string *)&local_268);
  std::__cxx11::string::~string((string *)&local_288);
  std::__cxx11::string::~string((string *)&local_2a8);
  std::__cxx11::string::~string((string *)&local_2c8);
  std::__cxx11::string::~string((string *)&local_2e8);
  glu::ProgramSources::~ProgramSources(&local_f8);
  std::__cxx11::string::~string((string *)&fragPrec);
  std::__cxx11::string::~string((string *)&vtxPrec);
  return __return_storage_ptr__;
}

Assistant:

static inline ProgramData defaultProgramData (CaseShaderType shaderType, const string& funcDefs, const string& mainStatements)
{
	const bool		isVertexCase	= shaderType == CASESHADERTYPE_VERTEX;
	const bool		isFragmentCase	= shaderType == CASESHADERTYPE_FRAGMENT;
	const string	vtxPrec			= getShaderPrecision(CASESHADERTYPE_VERTEX);
	const string	fragPrec		= getShaderPrecision(CASESHADERTYPE_FRAGMENT);

	return ProgramData(glu::ProgramSources() << glu::VertexSource(		"#version 300 es\n"
																		"in " + vtxPrec + " vec4 a_position;\n"
																		"in " + vtxPrec + " vec4 a_value;\n"
																		"out " + fragPrec + " vec4 v_value;\n"
																		+ (isVertexCase ? funcDefs : "") +
																		"void main (void)\n"
																		"{\n"
																		"	gl_Position = a_position;\n"
																		"	" + vtxPrec + " vec4 value = a_value;\n"
																		+ (isVertexCase ? mainStatements : "") +
																		"	v_value = value;\n"
																		"}\n")

											 << glu::FragmentSource(	"#version 300 es\n"
																		"layout (location = 0) out " + fragPrec + " vec4 o_color;\n"
																		"in " + fragPrec + " vec4 v_value;\n"
																		+ (isFragmentCase ? funcDefs : "") +
																		"void main (void)\n"
																		"{\n"
																		"	" + fragPrec + " vec4 value = v_value;\n"
																		+ (isFragmentCase ? mainStatements : "") +
																		"	o_color = value;\n"
																		"}\n"),
					  gls::AttribSpec("a_value",
									  Vec4(1.0f, 0.0f, 0.0f, 0.0f),
									  Vec4(0.0f, 1.0f, 0.0f, 0.0f),
									  Vec4(0.0f, 0.0f, 1.0f, 0.0f),
									  Vec4(0.0f, 0.0f, 0.0f, 1.0f)));
}